

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::addOutOfBlockDecl
          (Compilation *this,Scope *scope,ScopedNameSyntax *name,SyntaxNode *syntax,
          SymbolIndex index)

{
  size_t *psVar1;
  long lVar2;
  try_emplace_args_t *ptVar3;
  value_type_pointer ppVar4;
  ulong uVar5;
  int iVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  size_t sVar9;
  Diagnostic *this_00;
  uint uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
  *ppVar14;
  ulong uVar15;
  ulong uVar16;
  ulong pos0;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 args;
  ulong hash;
  undefined1 auVar17 [16];
  try_emplace_args_t tVar18;
  try_emplace_args_t tVar19;
  try_emplace_args_t tVar20;
  try_emplace_args_t tVar21;
  try_emplace_args_t tVar22;
  try_emplace_args_t tVar23;
  try_emplace_args_t tVar24;
  try_emplace_args_t tVar25;
  try_emplace_args_t tVar26;
  try_emplace_args_t tVar27;
  try_emplace_args_t tVar28;
  try_emplace_args_t tVar29;
  try_emplace_args_t tVar30;
  try_emplace_args_t tVar31;
  try_emplace_args_t tVar32;
  try_emplace_args_t tVar33;
  string_view sVar34;
  string_view sVar35;
  SourceRange range;
  SourceRange sourceRange;
  string_view fmt;
  format_args args_00;
  try_emplace_args_t local_111;
  ScopedNameSyntax *local_110;
  ulong local_108;
  ulong local_100;
  Compilation *local_f8;
  table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
  *local_f0;
  undefined8 local_e8;
  try_emplace_args_t tStack_e0;
  try_emplace_args_t tStack_df;
  try_emplace_args_t tStack_de;
  try_emplace_args_t tStack_dd;
  try_emplace_args_t tStack_dc;
  try_emplace_args_t tStack_db;
  try_emplace_args_t tStack_da;
  try_emplace_args_t tStack_d9;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  Scope *local_b8;
  char *local_b0;
  char *local_a8;
  Info *local_a0;
  Info *local_98;
  locator res;
  tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  local_70;
  tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  local_58;
  
  local_110 = (ScopedNameSyntax *)CONCAT44(local_110._4_4_,index);
  local_e8 = syntax;
  local_58.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  ._0_16_ = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(name->left).ptr);
  sVar34 = parsing::Token::valueText((Token *)&local_58);
  local_58.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  ._0_16_ = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)(name->right).ptr);
  sVar35 = parsing::Token::valueText((Token *)&local_58);
  local_b0 = sVar35._M_str;
  local_a0 = (Info *)sVar35._M_len;
  local_f0 = (table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
              *)&this->outOfBlockDecls;
  local_58.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_len = (size_t)local_a0;
  local_58.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
  super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
       (_Head_base<2UL,_const_slang::ast::Scope_*,_false>)
       (_Head_base<2UL,_const_slang::ast::Scope_*,_false>)scope;
  local_70.
  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  .super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>.
  super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.super__Tuple_impl<3UL,_bool>.
  super__Head_base<3UL,_bool,_false>._M_head_impl = (_Head_base<3UL,_bool,_false>)false;
  local_70.
  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  .super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>.
  super__Tuple_impl<2UL,_slang::ast::SymbolIndex,_bool>.
  super__Head_base<2UL,_slang::ast::SymbolIndex,_false>._M_head_impl = (SymbolIndex)local_110;
  local_70.
  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  .super__Head_base<0UL,_const_slang::syntax::SyntaxNode_*,_false>._M_head_impl = local_e8;
  local_110 = name;
  local_b8 = scope;
  local_a8 = sVar34._M_str;
  local_98 = (Info *)sVar34._M_len;
  local_70.
  super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
  .super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>.
  super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>._M_head_impl = name;
  local_58.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .
  super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl.
  _M_str = local_b0;
  local_58.
  super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
  .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>._M_head_impl
       = sVar34;
  sVar9 = hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
          ::operator()((hash<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_void>
                        *)local_f0,&local_58);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = sVar9;
  hash = SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),8) ^
         SUB168(auVar7 * ZEXT816(0x9e3779b97f4a7c15),0);
  uVar16 = hash >> ((byte)(this->outOfBlockDecls).table_.
                          super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                          .arrays.groups_size_index & 0x3f);
  lVar2 = (hash & 0xff) * 4;
  tVar18 = *(try_emplace_args_t *)(&UNK_0047c76c + lVar2);
  tVar19 = *(try_emplace_args_t *)(&UNK_0047c76d + lVar2);
  tVar20 = *(try_emplace_args_t *)(&UNK_0047c76e + lVar2);
  tVar21 = *(try_emplace_args_t *)(&UNK_0047c76f + lVar2);
  uVar11 = (ulong)((uint)hash & 7);
  uVar13 = 0;
  pos0 = uVar16;
  tVar22 = tVar18;
  tVar23 = tVar19;
  tVar24 = tVar20;
  tVar25 = tVar21;
  tVar26 = tVar18;
  tVar27 = tVar19;
  tVar28 = tVar20;
  tVar29 = tVar21;
  tVar30 = tVar18;
  tVar31 = tVar19;
  tVar32 = tVar20;
  tVar33 = tVar21;
  do {
    args = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
           (this->outOfBlockDecls).table_.
           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
           .arrays.groups_;
    ptVar3 = (try_emplace_args_t *)(args.values_ + uVar16);
    auVar17[0] = -(*ptVar3 == tVar18);
    auVar17[1] = -(ptVar3[1] == tVar19);
    auVar17[2] = -(ptVar3[2] == tVar20);
    auVar17[3] = -(ptVar3[3] == tVar21);
    auVar17[4] = -(ptVar3[4] == tVar22);
    auVar17[5] = -(ptVar3[5] == tVar23);
    auVar17[6] = -(ptVar3[6] == tVar24);
    auVar17[7] = -(ptVar3[7] == tVar25);
    auVar17[8] = -(ptVar3[8] == tVar26);
    auVar17[9] = -(ptVar3[9] == tVar27);
    auVar17[10] = -(ptVar3[10] == tVar28);
    auVar17[0xb] = -(ptVar3[0xb] == tVar29);
    auVar17[0xc] = -(ptVar3[0xc] == tVar30);
    auVar17[0xd] = -(ptVar3[0xd] == tVar31);
    auVar17[0xe] = -(ptVar3[0xe] == tVar32);
    auVar17[0xf] = -(ptVar3[0xf] == tVar33);
    uVar10 = (uint)(ushort)((ushort)(SUB161(auVar17 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar17 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar17 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar17 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar17 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar17 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar17 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar17 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar17 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar17 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar17 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar17 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar17 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar17 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar17 >> 0x77,0) & 1) << 0xe);
    uVar12 = uVar13;
    uVar15 = uVar16;
    if (uVar10 != 0) {
      ppVar4 = (this->outOfBlockDecls).table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
               .arrays.elements_;
      local_e8 = (SyntaxNode *)
                 CONCAT17(tVar25,CONCAT16(tVar24,CONCAT15(tVar23,CONCAT14(tVar22,CONCAT13(tVar21,
                                                  CONCAT12(tVar20,CONCAT11(tVar19,tVar18)))))));
      ppVar14 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
                 *)name;
      local_108 = pos0;
      local_100 = hash;
      local_f8 = this;
      tStack_e0 = tVar26;
      tStack_df = tVar27;
      tStack_de = tVar28;
      tStack_dd = tVar29;
      tStack_dc = tVar30;
      tStack_db = tVar31;
      tStack_da = tVar32;
      tStack_d9 = tVar33;
      local_d8 = args;
      local_d0 = uVar16;
      local_c8 = uVar13;
      local_c0 = uVar11;
      do {
        iVar6 = 0;
        if (uVar10 != 0) {
          for (; (uVar10 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        name = (ScopedNameSyntax *)
               ((long)&ppVar4[uVar16 * 0xf].first.
                       super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       .
                       super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                       .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                       super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl +
               (ulong)(uint)(iVar6 << 6));
        bVar8 = std::
                __tuple_compare<std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_0UL,_3UL>
                ::__eq(&local_58,
                       (tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                        *)name);
        if (!bVar8) {
          uVar10 = uVar10 - 1 & uVar10;
          name = (ScopedNameSyntax *)ppVar14;
        }
        this = local_f8;
        pos0 = local_108;
        hash = local_100;
        if (bVar8) goto LAB_0014454f;
        ppVar14 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
                   *)name;
      } while (uVar10 != 0);
      uVar11 = local_c0;
      uVar12 = local_c8;
      uVar15 = local_d0;
      args = local_d8;
      tVar18 = local_e8._0_1_;
      tVar19 = local_e8._1_1_;
      tVar20 = local_e8._2_1_;
      tVar21 = local_e8._3_1_;
      tVar22 = local_e8._4_1_;
      tVar23 = local_e8._5_1_;
      tVar24 = local_e8._6_1_;
      tVar25 = local_e8._7_1_;
      tVar26 = tStack_e0;
      tVar27 = tStack_df;
      tVar28 = tStack_de;
      tVar29 = tStack_dd;
      tVar30 = tStack_dc;
      tVar31 = tStack_db;
      tVar32 = tStack_da;
      tVar33 = tStack_d9;
      if (bVar8) goto LAB_0014454f;
    }
    args.values_ = args.values_ + uVar16;
    if ((*(byte *)((long)&(args.values_)->field_0 + 0xf) &
        (&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>::
          is_not_overflowed(unsigned_long)::shift)[uVar11]) == 0) break;
    uVar5 = (this->outOfBlockDecls).table_.
            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
            .arrays.groups_size_mask;
    uVar13 = uVar12 + 1;
    uVar16 = uVar15 + uVar12 + 1 & uVar5;
  } while (uVar13 <= uVar5);
  name = (ScopedNameSyntax *)0x0;
LAB_0014454f:
  ppVar14 = (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
             *)name;
  if ((pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
       *)name ==
      (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
       *)0x0) {
    if ((this->outOfBlockDecls).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
        .size_ctrl.size <
        (this->outOfBlockDecls).table_.
        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
        .size_ctrl.ml) {
      args.values_ = (value<fmt::v11::context> *)&local_111;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
      ::
      nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>
                (&res,local_f0,(arrays_type *)local_f0,pos0,hash,(try_emplace_args_t *)args.values_,
                 &local_58,&local_70);
      psVar1 = &(this->outOfBlockDecls).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>,_slang::hash<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::equal_to<std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>_>,_std::allocator<std::pair<const_std::tuple<std::basic_string_view<char>,_std::basic_string_view<char>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>_>_>
                .size_ctrl.size;
      *psVar1 = *psVar1 + 1;
      ppVar14 = res.p;
    }
    else {
      args.values_ = (value<fmt::v11::context> *)&local_70;
      boost::unordered::detail::foa::
      table_core<boost::unordered::detail::foa::flat_map_types<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,void>,std::equal_to<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>>,std::allocator<std::pair<std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>const,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>>>
      ::
      unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::tuple<std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>,slang::ast::Scope_const*>,std::tuple<slang::syntax::SyntaxNode_const*,slang::syntax::ScopedNameSyntax_const*,slang::ast::SymbolIndex,bool>>
                (&res,local_f0,hash,&local_111,&local_58,
                 (tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                  *)args.values_);
      ppVar14 = res.p;
    }
  }
  if ((local_a0 != (Info *)0x0 && local_98 != (Info *)0x0) &&
      (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
       *)name !=
      (pair<const_std::tuple<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>,_std::tuple<const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>_>
       *)0x0) {
    local_58.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_len = (size_t)local_98;
    local_58.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
    super__Head_base<2UL,_const_slang::ast::Scope_*,_false>._M_head_impl =
         (_Head_base<2UL,_const_slang::ast::Scope_*,_false>)
         (_Head_base<2UL,_const_slang::ast::Scope_*,_false>)local_a8;
    local_58.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .
    super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Head_base<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_str = local_b0;
    local_58.
    super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
    .super__Head_base<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_false>.
    _M_head_impl._M_len = (size_t)local_a0;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x6;
    args_00.field_1.values_ = args.values_;
    args_00.desc_ = (unsigned_long_long)&local_58;
    ::fmt::v11::vformat_abi_cxx11_((string *)&res,(v11 *)"{}::{}",fmt,args_00);
    range = slang::syntax::SyntaxNode::sourceRange
                      ((SyntaxNode *)
                       (ppVar14->second).
                       super__Tuple_impl<0UL,_const_slang::syntax::SyntaxNode_*,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                       .
                       super__Tuple_impl<1UL,_const_slang::syntax::ScopedNameSyntax_*,_slang::ast::SymbolIndex,_bool>
                       .super__Head_base<1UL,_const_slang::syntax::ScopedNameSyntax_*,_false>.
                       _M_head_impl);
    sourceRange = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)local_110);
    this_00 = Scope::addDiag(local_b8,(DiagCode)0x2a000a,sourceRange);
    Diagnostic::operator<<(this_00,(string *)&res);
    Diagnostic::addNote(this_00,(DiagCode)0xa0001,range);
    if (res.pg != (group15<boost::unordered::detail::foa::plain_integral> *)&res.p) {
      operator_delete(res.pg,(size_t)((long)&((res.p)->first).
                                             super__Tuple_impl<0UL,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                             .
                                             super__Tuple_impl<1UL,_std::basic_string_view<char,_std::char_traits<char>_>,_const_slang::ast::Scope_*>
                                             .super__Tuple_impl<2UL,_const_slang::ast::Scope_*>.
                                             super__Head_base<2UL,_const_slang::ast::Scope_*,_false>
                                             ._M_head_impl + 1));
    }
  }
  return;
}

Assistant:

void Compilation::addOutOfBlockDecl(const Scope& scope, const ScopedNameSyntax& name,
                                    const SyntaxNode& syntax, SymbolIndex index) {
    SLANG_ASSERT(!isFrozen());

    std::string_view className = name.left->getLastToken().valueText();
    std::string_view declName = name.right->getLastToken().valueText();
    auto [it, inserted] = outOfBlockDecls.emplace(std::make_tuple(className, declName, &scope),
                                                  std::make_tuple(&syntax, &name, index, false));

    if (!inserted && !className.empty() && !declName.empty()) {
        std::string combined = fmt::format("{}::{}", className, declName);
        auto range = std::get<1>(it->second)->sourceRange();

        auto& diag = scope.addDiag(diag::Redefinition, name.sourceRange());
        diag << combined;
        diag.addNote(diag::NotePreviousDefinition, range);
    }
}